

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

QJsonValueRef __thiscall QJsonObject::atImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  QJsonValueConstRef QVar1;
  QLatin1StringView s;
  QLatin1String key_00;
  bool bVar2;
  qsizetype qVar3;
  QCborContainerPrivate *pQVar4;
  QCborContainerPrivate *value;
  long idx;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  qsizetype index;
  bool keyExists;
  QCborContainerPrivate *in_stack_fffffffffffffee8;
  QCborContainerPrivate *in_stack_fffffffffffffef0;
  QCborValue *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  ContainerDisposition in_stack_ffffffffffffff04;
  QCborValue *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QCborContainerPrivate *in_stack_ffffffffffffff18;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_stack_ffffffffffffff20;
  QJsonValue *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar5;
  undefined8 local_60;
  undefined8 local_58;
  QCborContainerPrivate local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4940d0);
  if (bVar2) {
    in_stack_ffffffffffffff38 = (QJsonValue *)operator_new(0x40);
    QCborContainerPrivate::QCborContainerPrivate(in_stack_fffffffffffffef0);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  }
  bVar5 = 0;
  key_00.m_data._0_7_ = in_stack_ffffffffffffff88;
  key_00.m_size = in_RDX;
  key_00.m_data._7_1_ = 0;
  qVar3 = indexOf<QLatin1String>(in_stack_ffffffffffffff20,key_00,(bool *)in_stack_ffffffffffffff18)
  ;
  if ((bVar5 & 1) == 0) {
    pQVar4 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494163);
    QList<QtCbor::Element>::size(&pQVar4->elements);
    detach((QJsonObject *)in_stack_ffffffffffffff08,
           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494196);
    s.m_size._4_4_ = in_stack_ffffffffffffff14;
    s.m_size._0_4_ = in_stack_ffffffffffffff10;
    s.m_data = (char *)in_stack_ffffffffffffff18;
    ::QCborValue::QCborValue(in_stack_fffffffffffffef8,s);
    QCborContainerPrivate::insertAt
              (in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffef0);
    value = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494206);
    idx = qVar3 + 1;
    pQVar4 = &local_50;
    QJsonValue::QJsonValue((QJsonValue *)pQVar4,(Type)((ulong)idx >> 0x20));
    ::QCborValue::fromJsonValue(in_stack_ffffffffffffff38);
    QCborContainerPrivate::insertAt(pQVar4,idx,(QCborValue *)value,in_stack_ffffffffffffff04);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffef0);
    QJsonValue::~QJsonValue((QJsonValue *)0x494275);
  }
  QJsonValueRef::QJsonValueRef
            ((QJsonValueRef *)in_stack_fffffffffffffef0,(QJsonObject *)in_stack_fffffffffffffee8,
             0x494301);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1._8_4_ = (int)local_58;
  QVar1.field_0 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)local_60;
  QVar1._12_4_ = (int)((ulong)local_58 >> 0x20);
  return (QJsonValueRef)QVar1;
}

Assistant:

QJsonValueRef QJsonObject::atImpl(T key)
{
    if (!o)
        o = new QCborContainerPrivate;

    bool keyExists = false;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists) {
        detach(o->elements.size() / 2 + 1);
        o->insertAt(index, key);
        o->insertAt(index + 1, QCborValue::fromJsonValue(QJsonValue()));
    }
    // detaching will happen if and when this QJsonValueRef is assigned to
    return QJsonValueRef(this, index / 2);
}